

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall t_py_generator::generate_service_server(t_py_generator *this,t_service *tservice)

{
  bool bVar1;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_service *ptVar2;
  ostream *poVar3;
  ulong uVar4;
  string *psVar5;
  reference pptVar6;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_498;
  t_function **local_490;
  string local_488;
  string local_468 [32];
  string local_448;
  string local_428 [32];
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_188;
  t_function **local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  allocator local_91;
  string local_90 [8];
  string extends_processor;
  allocator local_59;
  undefined1 local_58 [8];
  string extends;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_py_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)((long)&extends.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  ptVar2 = t_service::get_extends(tservice);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends(tservice);
    type_name_abi_cxx11_(&local_b8,this,&ptVar2->super_t_type);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   ".Processor, ");
    std::__cxx11::string::operator=(local_90,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  if ((this->gen_zope_interface_ & 1U) == 0) {
    poVar3 = std::operator<<((ostream *)&this->f_service_,"class Processor(");
    poVar3 = std::operator<<(poVar3,local_90);
    poVar3 = std::operator<<(poVar3,"Iface, TProcessor):");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar3 = std::operator<<((ostream *)&this->f_service_,"@implementer(Iface)");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"class Processor(");
    poVar3 = std::operator<<(poVar3,local_90);
    poVar3 = std::operator<<(poVar3,"TProcessor):");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_up(&this->super_t_generator);
  poVar3 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
  poVar3 = std::operator<<(poVar3,"def __init__(self, handler):");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    if ((this->gen_zope_interface_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_178,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_178);
      poVar3 = std::operator<<(poVar3,(string *)local_58);
      poVar3 = std::operator<<(poVar3,".Processor.__init__(self, handler)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_178);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_158,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_158);
      poVar3 = std::operator<<(poVar3,(string *)local_58);
      poVar3 = std::operator<<(poVar3,".Processor.__init__(self, Iface(handler))");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  else {
    if ((this->gen_zope_interface_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_118);
      poVar3 = std::operator<<(poVar3,"self._handler = handler");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_f8,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_f8);
      poVar3 = std::operator<<(poVar3,"self._handler = Iface(handler)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_138);
    poVar3 = std::operator<<(poVar3,"self._processMap = {}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_138);
  }
  local_180 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  extends.field_2._8_8_ = local_180;
  while( true ) {
    local_188._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&extends.field_2 + 8),&local_188);
    if (!bVar1) break;
    t_generator::indent_abi_cxx11_(&local_1a8,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1a8);
    poVar3 = std::operator<<(poVar3,"self._processMap[\"");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar6);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    poVar3 = std::operator<<(poVar3,"\"] = Processor.process_");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar6);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1a8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&extends.field_2 + 8));
  }
  t_generator::indent_abi_cxx11_(&local_1c8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,"self._on_message_begin = None");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c8);
  t_generator::indent_down(&this->super_t_generator);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,"def on_message_begin(self, func):");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e8);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_208,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"self._on_message_begin = func");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_208);
  t_generator::indent_down(&this->super_t_generator);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"def process(self, iprot, oprot):");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_228);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_248,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"(name, type, seqid) = iprot.readMessageBegin()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_248);
  t_generator::indent_abi_cxx11_(&local_268,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_268);
  poVar3 = std::operator<<(poVar3,"if self._on_message_begin:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_268);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_288,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_288);
  poVar3 = std::operator<<(poVar3,"self._on_message_begin(name, type, seqid)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_288);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2a8);
  poVar3 = std::operator<<(poVar3,"if name not in self._processMap:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2a8);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2c8);
  poVar3 = std::operator<<(poVar3,"iprot.skip(TType.STRUCT)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2e8,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
  poVar3 = std::operator<<(poVar3,"iprot.readMessageEnd()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_308,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&local_308);
  poVar3 = std::operator<<(poVar3,
                           "x = TApplicationException(TApplicationException.UNKNOWN_METHOD, \'Unknown function %s\' % (name))"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_328,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&local_328);
  poVar3 = std::operator<<(poVar3,"oprot.writeMessageBegin(name, TMessageType.EXCEPTION, seqid)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_348,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&local_348);
  poVar3 = std::operator<<(poVar3,"x.write(oprot)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_368,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&local_368);
  poVar3 = std::operator<<(poVar3,"oprot.writeMessageEnd()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_388,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&local_388);
  poVar3 = std::operator<<(poVar3,"oprot.trans.flush()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  if ((this->gen_twisted_ & 1U) == 0) {
    t_generator::indent_abi_cxx11_(&local_3c8,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3c8);
    poVar3 = std::operator<<(poVar3,"return");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3c8);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_3a8,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3a8);
    poVar3 = std::operator<<(poVar3,"return defer.succeed(None)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3a8);
  }
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_3e8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3e8);
  poVar3 = std::operator<<(poVar3,"else:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3e8);
  if (((this->gen_twisted_ & 1U) == 0) && ((this->gen_tornado_ & 1U) == 0)) {
    t_generator::indent_abi_cxx11_(&local_448,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_448);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_468);
    poVar3 = std::operator<<(poVar3,local_468);
    poVar3 = std::operator<<(poVar3,"self._processMap[name](self, seqid, iprot, oprot)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string((string *)&local_448);
    t_generator::indent_abi_cxx11_(&local_488,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_488);
    poVar3 = std::operator<<(poVar3,"return True");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_488);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_408,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_408);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_428);
    poVar3 = std::operator<<(poVar3,local_428);
    poVar3 = std::operator<<(poVar3,"return self._processMap[name](self, seqid, iprot, oprot)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string((string *)&local_408);
  }
  t_generator::indent_down(&this->super_t_generator);
  local_490 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  extends.field_2._8_8_ = local_490;
  while( true ) {
    local_498._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&extends.field_2 + 8),&local_498);
    if (!bVar1) break;
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    generate_process_function(this,tservice,*pptVar6);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&extends.field_2 + 8));
  }
  t_generator::indent_down(&this->super_t_generator);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_58);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_py_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_processor = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_processor = extends + ".Processor, ";
  }

  f_service_ << endl << endl;

  // Generate the header portion
  if (gen_zope_interface_) {
    f_service_ << "@implementer(Iface)" << endl
               << "class Processor(" << extends_processor << "TProcessor):" << endl;
  } else {
    f_service_ << "class Processor(" << extends_processor << "Iface, TProcessor):" << endl;
  }

  indent_up();

  indent(f_service_) << "def __init__(self, handler):" << endl;
  indent_up();
  if (extends.empty()) {
    if (gen_zope_interface_) {
      f_service_ << indent() << "self._handler = Iface(handler)" << endl;
    } else {
      f_service_ << indent() << "self._handler = handler" << endl;
    }

    f_service_ << indent() << "self._processMap = {}" << endl;
  } else {
    if (gen_zope_interface_) {
      f_service_ << indent() << extends << ".Processor.__init__(self, Iface(handler))" << endl;
    } else {
      f_service_ << indent() << extends << ".Processor.__init__(self, handler)" << endl;
    }
  }
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << indent() << "self._processMap[\"" << (*f_iter)->get_name()
               << "\"] = Processor.process_" << (*f_iter)->get_name() << endl;
  }
  f_service_ << indent() << "self._on_message_begin = None" << endl;
  indent_down();
  f_service_ << endl;

  f_service_ << indent() << "def on_message_begin(self, func):" << endl;
  indent_up();
    f_service_ << indent() << "self._on_message_begin = func" << endl;
  indent_down();
  f_service_ << endl;

  // Generate the server implementation
  f_service_ << indent() << "def process(self, iprot, oprot):" << endl;
  indent_up();

  f_service_ << indent() << "(name, type, seqid) = iprot.readMessageBegin()" << endl;
  f_service_ << indent() << "if self._on_message_begin:" << endl;
  indent_up();
    f_service_ << indent() << "self._on_message_begin(name, type, seqid)" << endl;
  indent_down();

  // TODO(mcslee): validate message

  // HOT: dictionary function lookup
  f_service_ << indent() << "if name not in self._processMap:" << endl;
  indent_up();
  f_service_ << indent() << "iprot.skip(TType.STRUCT)" << endl
             << indent() << "iprot.readMessageEnd()" << endl
             << indent()
             << "x = TApplicationException(TApplicationException.UNKNOWN_METHOD, 'Unknown "
                "function %s' % (name))"
             << endl
             << indent() << "oprot.writeMessageBegin(name, TMessageType.EXCEPTION, seqid)" << endl
             << indent() << "x.write(oprot)" << endl
             << indent() << "oprot.writeMessageEnd()" << endl
             << indent() << "oprot.trans.flush()" << endl;

  if (gen_twisted_) {
    f_service_ << indent() << "return defer.succeed(None)" << endl;
  } else {
    f_service_ << indent() << "return" << endl;
  }
  indent_down();

  f_service_ << indent() << "else:" << endl;

  if (gen_twisted_ || gen_tornado_) {
    f_service_ << indent() << indent_str()
               << "return self._processMap[name](self, seqid, iprot, oprot)" << endl;
  } else {
    f_service_ << indent() << indent_str() << "self._processMap[name](self, seqid, iprot, oprot)"
               << endl;

    // Read end of args field, the T_STOP, and the struct close
    f_service_ << indent() << "return True" << endl;
  }

  indent_down();

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << endl;
    generate_process_function(tservice, *f_iter);
  }

  indent_down();
}